

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool Fossilize::pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (void *pNext,MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value,
               DynamicStateInfo *dynamic_state_info)

{
  VkStructureType VVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  ushort uVar7;
  VkPipelineLibraryCreateInfoKHR *create_info;
  VkImageLayout value_00;
  Value *out_value_00;
  void *value_01;
  StringRefType *value_02;
  bool bVar8;
  uint32_t i;
  ulong uVar9;
  long lVar10;
  VkPipeline *ppVVar11;
  StringRefType *pSVar12;
  ulong uVar13;
  undefined4 uVar14;
  char *local_148;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  Value components;
  Value value;
  Value comp;
  Value extent;
  Value next;
  Value extent_1;
  Value extent_2;
  Value discardRectangle;
  char *local_98;
  SizeType SStack_90;
  undefined4 uStack_8c;
  Data local_88;
  Data *local_78;
  StringRefType local_70;
  StringRefType local_60;
  string local_50;
  
  local_88.n.i64 = (Number)0x0;
  local_88.s.str = (Ch *)0x4000000000000;
  local_78 = &out_value->data_;
  create_info = (VkPipelineLibraryCreateInfoKHR *)pnext_chain_skip_ignored_entries(pNext);
  uVar4 = components.data_.s.str;
  uVar3 = value.data_.s.str;
  uVar5 = comp.data_.s.str;
  do {
    if (create_info == (VkPipelineLibraryCreateInfoKHR *)0x0) {
      if (&local_88 != local_78) {
        local_78->n = local_88.n;
        (&local_78->n)[1] = (Number)local_88.s.str;
      }
      return true;
    }
    pSVar12 = (StringRefType *)&components;
    next.data_.n = (Number)0x0;
    next.data_.s.str = (Ch *)0x0;
    VVar1 = create_info->sType;
    value.data_.s.str = (Ch *)uVar3;
    if (VVar1 != VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO) {
      comp.data_._12_4_ = (undefined4)((ulong)uVar5 >> 0x20);
      components.data_.s.str = (Ch *)uVar4;
      if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_STREAM_CREATE_INFO_EXT) {
        value.data_.n = (Number)0x0;
        value.data_.s.str = (Ch *)0x3000000000000;
        comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
        comp.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkStructureType>(&value,(StringRefType *)&comp,create_info->sType,alloc);
        local_148._4_1_ = '\0';
        local_148._5_1_ = '\0';
        local_148._6_1_ = '\0';
        local_148._7_1_ = '\0';
        local_148._0_4_ = create_info->libraryCount;
        components.data_.s.str = (Ch *)0x4050000003138c6;
        components.data_.n = (Number)0x5;
        _uStack_140 = (ulong)(-1 < (int)create_info->libraryCount) << 0x35 | 0x1d6000000000000;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&value,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)pSVar12,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_148,alloc);
        local_148._4_1_ = '\0';
        local_148._5_1_ = '\0';
        local_148._6_1_ = '\0';
        local_148._7_1_ = '\0';
        local_148._0_4_ = *(uint *)&create_info->field_0x14;
        components.data_.s.str = (Ch *)0x40500000030be26;
        components.data_.n = (Number)0x13;
        _uStack_140 = (ulong)(-1 < (int)*(uint *)&create_info->field_0x14) << 0x35 |
                      0x1d6000000000000;
        goto LAB_001439fb;
      }
      if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO) {
        value.data_.n = (Number)0x0;
        value.data_.s.str = (Ch *)0x3000000000000;
        comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
        comp.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkStructureType>(&value,(StringRefType *)&comp,create_info->sType,alloc);
        local_148._4_1_ = '\0';
        local_148._5_1_ = '\0';
        local_148._6_1_ = '\0';
        local_148._7_1_ = '\0';
        local_148._0_4_ = create_info[1].sType;
        components.data_.s.str = (Ch *)0x40500000030bfcd;
        components.data_.n = (Number)0x15;
        _uStack_140 = (ulong)(-1 < (int)create_info[1].sType) << 0x35 | 0x1d6000000000000;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&value,&components,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_148,alloc);
        local_148._4_1_ = '\0';
        local_148._5_1_ = '\0';
        local_148._6_1_ = '\0';
        local_148._7_1_ = '\0';
        local_148._0_4_ = *(uint *)&create_info[1].field_0x4;
        components.data_.s.str = (Ch *)0x40500000030bfe3;
        components.data_.n = (Number)0x17;
        _uStack_140 = (ulong)(-1 < (int)*(uint *)&create_info[1].field_0x4) << 0x35 |
                      0x1d6000000000000;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&value,&components,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_148,alloc);
        local_148._4_1_ = '\0';
        local_148._5_1_ = '\0';
        local_148._6_1_ = '\0';
        local_148._7_1_ = '\0';
        local_148._0_4_ = create_info->libraryCount;
        components.data_.s.str = (Ch *)0x40500000030b8aa;
        components.data_.n = (Number)0x8;
        _uStack_140 = (ulong)(-1 < (int)create_info->libraryCount) << 0x35 | 0x1d6000000000000;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&value,&components,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_148,alloc);
        if (*(int *)&create_info->field_0x14 != 0) {
          components.data_.n = (Number)0x0;
          components.data_.s.str = (Ch *)0x4000000000000;
          uVar9 = 0;
          do {
            uVar2 = *(uint *)((long)create_info->pLibraries + uVar9 * 4);
            local_148._4_1_ = '\0';
            local_148._5_1_ = '\0';
            local_148._6_1_ = '\0';
            local_148._7_1_ = '\0';
            local_148._0_4_ = uVar2;
            _uStack_140 = (ulong)(-1 < (int)uVar2) << 0x35 | 0x1d6000000000000;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack(&components,
                       (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_148,alloc);
            uVar9 = uVar9 + 1;
          } while (uVar9 < *(uint *)&create_info->field_0x14);
          _uStack_140 = (Ch *)0x40500000030bffb;
          local_148 = (char *)0x16;
LAB_0014164a:
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember(&value,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)&local_148,&components,alloc);
        }
        goto LAB_00143a06;
      }
      value.data_._12_4_ = (undefined4)((ulong)uVar3 >> 0x20);
      comp.data_._8_8_ = uVar5;
      if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO) {
        components.data_.n = (Number)0x0;
        components.data_.s.str = (Ch *)0x3000000000000;
        value.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
        value.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkStructureType>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)pSVar12,(StringRefType *)&value,create_info->sType,alloc);
        if (create_info->libraryCount != 0) {
          comp.data_.n = (Number)0x0;
          comp.data_.s.str = (Ch *)0x4000000000000;
          uVar9 = 0;
          do {
            uVar2 = *(uint *)((long)create_info->pLibraries + uVar9 * 4);
            local_148._4_1_ = '\0';
            local_148._5_1_ = '\0';
            local_148._6_1_ = '\0';
            local_148._7_1_ = '\0';
            local_148._0_4_ = uVar2;
            _uStack_140 = (ulong)(-1 < (int)uVar2) << 0x35 | 0x1d6000000000000;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack(&comp,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)&local_148,alloc);
            uVar9 = uVar9 + 1;
          } while (uVar9 < create_info->libraryCount);
          _uStack_140 = (Ch *)0x40500000030c38d;
          local_148 = (char *)0x9;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)pSVar12,
                      (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_148,&comp,alloc);
        }
        if (create_info[1].sType != VK_STRUCTURE_TYPE_APPLICATION_INFO) {
          comp.data_.n = (Number)0x0;
          comp.data_.s.str = (Ch *)0x4000000000000;
          uVar9 = 0;
          do {
            local_148 = (char *)(long)*(int *)((long)create_info[1].pNext + uVar9 * 4);
            uVar7 = 0x1f6;
            if ((long)local_148 < 0) {
              uVar7 = 0xb6;
            }
            _uStack_140 = (ulong)uVar7 << 0x30;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack(&comp,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)&local_148,alloc);
            uVar9 = uVar9 + 1;
          } while (uVar9 < create_info[1].sType);
          _uStack_140 = (Ch *)0x40500000030c397;
          local_148 = (char *)0xb;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)pSVar12,
                      (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_148,&comp,alloc);
        }
        if (create_info[1].libraryCount != 0) {
          comp.data_.n = (Number)0x0;
          comp.data_.s.str = (Ch *)0x4000000000000;
          uVar9 = 0;
          do {
            uVar2 = *(uint *)((long)create_info[1].pLibraries + uVar9 * 4);
            local_148._4_1_ = '\0';
            local_148._5_1_ = '\0';
            local_148._6_1_ = '\0';
            local_148._7_1_ = '\0';
            local_148._0_4_ = uVar2;
            _uStack_140 = (ulong)(-1 < (int)uVar2) << 0x35 | 0x1d6000000000000;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack(&comp,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)&local_148,alloc);
            uVar9 = uVar9 + 1;
          } while (uVar9 < create_info[1].libraryCount);
          _uStack_140 = (Ch *)0x40500000030c3a3;
          local_148 = (char *)0x10;
LAB_00143d06:
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)pSVar12,
                      (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_148,&comp,alloc);
        }
        goto LAB_00143d1a;
      }
      components.data_._12_4_ = (undefined4)((ulong)uVar4 >> 0x20);
      if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO) {
        local_148 = (char *)0x0;
        _uStack_140 = (Ch *)0x3000000000000;
        components.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
        components.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkStructureType>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_148,pSVar12,create_info->sType,alloc);
        value.data_.n = (Number)anon_var_dwarf_12cf2;
        value.data_._8_4_ = 0xe;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkPipelineRobustnessBufferBehavior>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_148,(StringRefType *)&value,create_info->libraryCount,alloc);
        comp.data_.n = (Number)anon_var_dwarf_12cfe;
        comp.data_._8_4_ = 0xc;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkPipelineRobustnessBufferBehavior>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_148,(StringRefType *)&comp,
                   *(VkPipelineRobustnessBufferBehavior *)&create_info->pLibraries,alloc);
        extent.data_.n = (Number)anon_var_dwarf_12ce6;
        extent.data_._8_4_ = 0xe;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkPipelineRobustnessBufferBehavior>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_148,(StringRefType *)&extent,
                   *(VkPipelineRobustnessBufferBehavior *)&create_info->field_0x14,alloc);
        extent_1.data_.n = (Number)anon_var_dwarf_12cda;
        extent_1.data_._8_4_ = 6;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkPipelineRobustnessImageBehavior>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_148,(StringRefType *)&extent_1,
                   *(VkPipelineRobustnessImageBehavior *)((long)&create_info->pLibraries + 4),alloc)
        ;
        goto LAB_00143ade;
      }
      if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT) {
        value.data_.n = (Number)0x0;
        value.data_.s.str = (Ch *)0x3000000000000;
        comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
        comp.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkStructureType>(&value,(StringRefType *)&comp,create_info->sType,alloc);
        local_148._4_1_ = '\0';
        local_148._5_1_ = '\0';
        local_148._6_1_ = '\0';
        local_148._7_1_ = '\0';
        local_148._0_4_ = create_info->libraryCount;
        components.data_.s.str = (Ch *)0x4050000003138c6;
        components.data_.n = (Number)0x5;
        _uStack_140 = (ulong)(-1 < (int)create_info->libraryCount) << 0x35 | 0x1d6000000000000;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&value,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)pSVar12,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_148,alloc);
        extent.data_.n = (Number)anon_var_dwarf_12b66;
        extent.data_._8_4_ = 0x14;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkDiscardRectangleModeEXT>
                  (&value,(StringRefType *)&extent,
                   *(VkDiscardRectangleModeEXT *)&create_info->field_0x14,alloc);
        local_148._4_1_ = '\0';
        local_148._5_1_ = '\0';
        local_148._6_1_ = '\0';
        local_148._7_1_ = '\0';
        local_148._0_4_ = *(uint *)&create_info->pLibraries;
        components.data_.s.str = (Ch *)0x40500000030c10c;
        components.data_.n = (Number)0x15;
        _uStack_140 = (ulong)(-1 < (int)*(uint *)&create_info->pLibraries) << 0x35 |
                      0x1d6000000000000;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&value,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)pSVar12,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_148,alloc);
        if ((dynamic_state_info != (DynamicStateInfo *)0x0) &&
           (dynamic_state_info->discard_rectangle == false)) {
          extent_1.data_.n = (Number)0x0;
          extent_1.data_.s.str = (Ch *)0x4000000000000;
          if (*(int *)&create_info->pLibraries != 0) {
            lVar10 = 0;
            uVar9 = 0;
            do {
              discardRectangle.data_.n = (Number)0x0;
              discardRectangle.data_.s.str = (Ch *)0x3000000000000;
              extent_2.data_.n = (Number)((long)"%0*x" + 3);
              extent_2.data_._8_4_ = 1;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember<int>(&discardRectangle,(StringRefType *)&extent_2,
                               *(int *)(*(long *)(create_info + 1) + lVar10),alloc);
              local_98 = (char *)((long)"descriptorBufferCaptureReplay" + 0x1c);
              SStack_90 = 1;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember<int>(&discardRectangle,(StringRefType *)&local_98,
                               *(int *)(*(long *)(create_info + 1) + 4 + lVar10),alloc);
              uVar2 = *(uint *)(*(long *)(create_info + 1) + 8 + lVar10);
              local_148._4_1_ = '\0';
              local_148._5_1_ = '\0';
              local_148._6_1_ = '\0';
              local_148._7_1_ = '\0';
              local_148._0_4_ = uVar2;
              components.data_.s.str = (Ch *)0x405000000348278;
              components.data_.n = (Number)0x5;
              _uStack_140 = (ulong)(-1 < (int)uVar2) << 0x35 | 0x1d6000000000000;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember(&discardRectangle,
                          (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)pSVar12,
                          (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&local_148,alloc);
              uVar2 = *(uint *)(*(long *)(create_info + 1) + 0xc + lVar10);
              local_148._4_1_ = '\0';
              local_148._5_1_ = '\0';
              local_148._6_1_ = '\0';
              local_148._7_1_ = '\0';
              local_148._0_4_ = uVar2;
              components.data_.s.str = (Ch *)0x40500000030bc82;
              components.data_.n = (Number)0x6;
              _uStack_140 = (ulong)(-1 < (int)uVar2) << 0x35 | 0x1d6000000000000;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember(&discardRectangle,
                          (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)pSVar12,
                          (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&local_148,alloc);
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::PushBack(&extent_1,&discardRectangle,alloc);
              uVar9 = uVar9 + 1;
              lVar10 = lVar10 + 0x10;
            } while (uVar9 < *(uint *)&create_info->pLibraries);
          }
          _uStack_140 = (Ch *)0x40500000030c122;
          local_148 = (char *)0x11;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember(&value,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)&local_148,&extent_1,alloc);
        }
        goto LAB_00143a06;
      }
      if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT) {
        value.data_.n = (Number)0x0;
        value.data_.s.str = (Ch *)0x3000000000000;
        comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
        comp.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkStructureType>(&value,(StringRefType *)&comp,create_info->sType,alloc);
        local_148._4_1_ = '\0';
        local_148._5_1_ = '\0';
        local_148._6_1_ = '\0';
        local_148._7_1_ = '\0';
        local_148._0_4_ = create_info->libraryCount;
        components.data_.s.str = (Ch *)0x4050000003138c6;
        components.data_.n = (Number)0x5;
        _uStack_140 = (ulong)(-1 < (int)create_info->libraryCount) << 0x35 | 0x1d6000000000000;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&value,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)pSVar12,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_148,alloc);
        extent.data_.n = (Number)anon_var_dwarf_129da;
        extent.data_._8_4_ = 0x1d;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkConservativeRasterizationModeEXT>
                  (&value,(StringRefType *)&extent,
                   *(VkConservativeRasterizationModeEXT *)&create_info->field_0x14,alloc);
        local_148 = (char *)(double)*(float *)&create_info->pLibraries;
        components.data_.s.str = (Ch *)0x40500000030be94;
        components.data_.n = (Number)0x20;
        _uStack_140 = (Ch *)0x216000000000000;
        goto LAB_001439fb;
      }
      if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT) {
        value.data_.n = (Number)0x0;
        value.data_.s.str = (Ch *)0x3000000000000;
        comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
        comp.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkStructureType>(&value,(StringRefType *)&comp,create_info->sType,alloc);
        local_148._4_1_ = '\0';
        local_148._5_1_ = '\0';
        local_148._6_1_ = '\0';
        local_148._7_1_ = '\0';
        local_148._0_4_ = create_info->libraryCount;
        components.data_.s.str = (Ch *)0x4050000003138c6;
        components.data_.n = (Number)0x5;
        _uStack_140 = (ulong)(-1 < (int)create_info->libraryCount) << 0x35 | 0x1d6000000000000;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&value,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)pSVar12,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_148,alloc);
        local_148._4_1_ = '\0';
        local_148._5_1_ = '\0';
        local_148._6_1_ = '\0';
        local_148._7_1_ = '\0';
        local_148._0_4_ = *(uint *)&create_info->field_0x14;
        components.data_.s.str = (Ch *)0x40500000030be16;
        components.data_.n = (Number)0xf;
        _uStack_140 = (ulong)(-1 < (int)*(uint *)&create_info->field_0x14) << 0x35 |
                      0x1d6000000000000;
        value_02 = (StringRefType *)&local_148;
        goto LAB_001439fe;
      }
      if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO) {
        value.data_.n = (Number)0x0;
        value.data_.s.str = (Ch *)0x3000000000000;
        comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
        comp.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkStructureType>(&value,(StringRefType *)&comp,create_info->sType,alloc);
        extent.data_.n = (Number)0x0;
        extent.data_.s.str = (Ch *)0x4000000000000;
        if (create_info->libraryCount != 0) {
          lVar10 = 0;
          uVar9 = 0;
          do {
            extent_1.data_.n = (Number)0x0;
            extent_1.data_.s.str = (Ch *)0x3000000000000;
            uVar2 = *(uint *)((long)create_info->pLibraries + lVar10);
            local_148._4_1_ = '\0';
            local_148._5_1_ = '\0';
            local_148._6_1_ = '\0';
            local_148._7_1_ = '\0';
            local_148._0_4_ = uVar2;
            components.data_.s.str = (Ch *)0x40500000030bd3f;
            components.data_.n = (Number)0x7;
            _uStack_140 = (ulong)(-1 < (int)uVar2) << 0x35 | 0x1d6000000000000;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&extent_1,&components,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&local_148,alloc);
            uVar2 = *(uint *)((long)create_info->pLibraries + lVar10 + 4);
            local_148._4_1_ = '\0';
            local_148._5_1_ = '\0';
            local_148._6_1_ = '\0';
            local_148._7_1_ = '\0';
            local_148._0_4_ = uVar2;
            components.data_.s.str = (Ch *)0x40500000030c0e2;
            components.data_.n = (Number)0x14;
            _uStack_140 = (ulong)(-1 < (int)uVar2) << 0x35 | 0x1d6000000000000;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&extent_1,&components,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&local_148,alloc);
            uVar2 = *(uint *)((long)create_info->pLibraries + lVar10 + 8);
            local_148._4_1_ = '\0';
            local_148._5_1_ = '\0';
            local_148._6_1_ = '\0';
            local_148._7_1_ = '\0';
            local_148._0_4_ = uVar2;
            components.data_.s.str = (Ch *)0x40500000030b82d;
            components.data_.n = (Number)0xa;
            _uStack_140 = (ulong)(-1 < (int)uVar2) << 0x35 | 0x1d6000000000000;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&extent_1,&components,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&local_148,alloc);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack(&extent,&extent_1,alloc);
            uVar9 = uVar9 + 1;
            lVar10 = lVar10 + 0xc;
          } while (uVar9 < create_info->libraryCount);
        }
        _uStack_140 = (Ch *)0x40500000030c0d1;
        local_148 = (char *)0x10;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&value,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)&local_148,&extent,alloc);
        next.data_.n = value.data_.n;
        next.data_.s.str = value.data_.s.str;
      }
      else {
        if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO) {
          local_148 = (char *)0x0;
          _uStack_140 = (Ch *)0x3000000000000;
          components.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
          components.data_._8_4_ = 5;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<VkStructureType>
                    ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_148,pSVar12,create_info->sType,alloc);
          value.data_.n = (Number)anon_var_dwarf_12962;
          value.data_._8_4_ = 0xc;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<VkTessellationDomainOrigin>
                    ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_148,(StringRefType *)&value,create_info->libraryCount,alloc);
LAB_00143ade:
          next.data_.s.length = local_148._0_4_;
          uVar14 = local_148._4_4_;
          next.data_._8_4_ = uStack_140;
          next.data_._12_4_ = uStack_13c;
        }
        else {
          if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_REDUCTION_MODE_CREATE_INFO) {
            local_148 = (char *)0x0;
            _uStack_140 = (Ch *)0x3000000000000;
            components.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
            components.data_._8_4_ = 5;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<VkStructureType>
                      ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_148,pSVar12,create_info->sType,alloc);
            value.data_.n = (Number)anon_var_dwarf_12b42;
            value.data_._8_4_ = 0xd;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<VkSamplerReductionMode>
                      ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_148,(StringRefType *)&value,create_info->libraryCount,alloc);
            goto LAB_00143ade;
          }
          if (VVar1 == VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT) {
            value.data_.n = (Number)0x0;
            value.data_.s.str = (Ch *)0x3000000000000;
            comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
            comp.data_._8_4_ = 5;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<VkStructureType>(&value,(StringRefType *)&comp,create_info->sType,alloc);
            extent.data_.n = (Number)anon_var_dwarf_12b06;
            extent.data_._8_4_ = 0x17;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<VkSampleCountFlagBits>
                      (&value,(StringRefType *)&extent,create_info->libraryCount,alloc);
            extent_1.data_.n = (Number)0x0;
            extent_1.data_.s.str = (Ch *)0x3000000000000;
            local_148._4_1_ = '\0';
            local_148._5_1_ = '\0';
            local_148._6_1_ = '\0';
            local_148._7_1_ = '\0';
            local_148._0_4_ = *(uint *)&create_info->field_0x14;
            components.data_.s.str = (Ch *)0x405000000348278;
            components.data_.n = (Number)0x5;
            _uStack_140 = (ulong)(-1 < (int)*(uint *)&create_info->field_0x14) << 0x35 |
                          0x1d6000000000000;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&extent_1,&components,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&local_148,alloc);
            local_148._4_1_ = '\0';
            local_148._5_1_ = '\0';
            local_148._6_1_ = '\0';
            local_148._7_1_ = '\0';
            local_148._0_4_ = *(uint *)&create_info->pLibraries;
            components.data_.s.str = (Ch *)0x40500000030bc82;
            components.data_.n = (Number)0x6;
            _uStack_140 = (ulong)(-1 < (int)*(uint *)&create_info->pLibraries) << 0x35 |
                          0x1d6000000000000;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&extent_1,&components,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&local_148,alloc);
            _uStack_140 = (Ch *)0x40500000030c076;
            local_148 = (char *)0x16;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&value,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                *)&local_148,&extent_1,alloc);
            if (*(int *)((long)&create_info->pLibraries + 4) != 0) {
              extent_1.data_.n = (Number)0x0;
              extent_1.data_.s.str = (Ch *)0x4000000000000;
              uVar9 = 0;
              do {
                discardRectangle.data_.n = (Number)0x0;
                discardRectangle.data_.s.str = (Ch *)0x3000000000000;
                local_148 = (char *)(double)*(float *)(*(long *)(create_info + 1) + uVar9 * 8);
                components.data_.s.str = (Ch *)0x4050000003128e5;
                components.data_.n = (Number)0x1;
                _uStack_140 = (Ch *)0x216000000000000;
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::AddMember(&discardRectangle,&components,
                            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)&local_148,alloc);
                local_148 = (char *)(double)*(float *)(*(long *)(create_info + 1) + 4 + uVar9 * 8);
                components.data_.s.str = (Ch *)0x40500000030c579;
                components.data_.n = (Number)0x1;
                _uStack_140 = (Ch *)0x216000000000000;
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::AddMember(&discardRectangle,&components,
                            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)&local_148,alloc);
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::PushBack(&extent_1,&discardRectangle,alloc);
                uVar9 = uVar9 + 1;
              } while (uVar9 < *(uint *)((long)&create_info->pLibraries + 4));
              _uStack_140 = (Ch *)0x40500000030c08d;
              local_148 = (char *)0xf;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember(&value,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  *)&local_148,&extent_1,alloc);
            }
LAB_00143a06:
            next.data_.s.length = value.data_.s.length;
            uVar14 = value.data_.s.hashcode;
            next.data_._8_4_ = value.data_._8_4_;
            next.data_._12_4_ = value.data_._12_4_;
          }
          else {
            if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT) {
              value.data_.n = (Number)0x0;
              value.data_.s.str = (Ch *)0x3000000000000;
              comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
              comp.data_._8_4_ = 5;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember<VkStructureType>(&value,(StringRefType *)&comp,create_info->sType,alloc);
              local_148._4_1_ = '\0';
              local_148._5_1_ = '\0';
              local_148._6_1_ = '\0';
              local_148._7_1_ = '\0';
              local_148._0_4_ = create_info->libraryCount;
              components.data_.s.str = (Ch *)0x40500000030c034;
              components.data_.n = (Number)0x15;
              _uStack_140 = (ulong)(-1 < (int)create_info->libraryCount) << 0x35 | 0x1d6000000000000
              ;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember(&value,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  *)pSVar12,
                          (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&local_148,alloc);
              if ((dynamic_state_info != (DynamicStateInfo *)0x0) &&
                 (((dynamic_state_info->sample_locations_enable != false ||
                   (create_info->libraryCount != 0)) &&
                  (dynamic_state_info->sample_locations == false)))) {
                extent.data_.n = (Number)0x0;
                extent.data_.s.str = (Ch *)0x3000000000000;
                extent_1.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                extent_1.data_._8_4_ = 5;
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::AddMember<VkStructureType>
                          ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)&extent,(StringRefType *)&extent_1,
                           *(VkStructureType *)&create_info->pLibraries,alloc);
                discardRectangle.data_.n = (Number)anon_var_dwarf_12b06;
                discardRectangle.data_._8_4_ = 0x17;
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::AddMember<VkSampleCountFlagBits>
                          ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)&extent,(StringRefType *)&discardRectangle,
                           *(VkSampleCountFlagBits *)&create_info[1].pNext,alloc);
                extent_2.data_.n = (Number)0x0;
                extent_2.data_.s.str = (Ch *)0x3000000000000;
                uVar2 = *(uint *)((long)&create_info[1].pNext + 4);
                local_148._4_1_ = '\0';
                local_148._5_1_ = '\0';
                local_148._6_1_ = '\0';
                local_148._7_1_ = '\0';
                local_148._0_4_ = uVar2;
                components.data_.s.str = (Ch *)0x405000000348278;
                components.data_.n = (Number)0x5;
                _uStack_140 = (ulong)(-1 < (int)uVar2) << 0x35 | 0x1d6000000000000;
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::AddMember(&extent_2,&components,
                            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)&local_148,alloc);
                local_148._4_1_ = '\0';
                local_148._5_1_ = '\0';
                local_148._6_1_ = '\0';
                local_148._7_1_ = '\0';
                local_148._0_4_ = create_info[1].libraryCount;
                components.data_.s.str = (Ch *)0x40500000030bc82;
                components.data_.n = (Number)0x6;
                _uStack_140 = (ulong)(-1 < (int)create_info[1].libraryCount) << 0x35 |
                              0x1d6000000000000;
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::AddMember(&extent_2,&components,
                            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)&local_148,alloc);
                _uStack_140 = (Ch *)0x40500000030c076;
                local_148 = (char *)0x16;
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)&extent,
                            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)&local_148,&extent_2,alloc);
                if (*(int *)&create_info[1].field_0x14 != 0) {
                  extent_2.data_.n = (Number)0x0;
                  extent_2.data_.s.str = (Ch *)0x4000000000000;
                  uVar9 = 0;
                  do {
                    local_98 = (char *)0x0;
                    _SStack_90 = (Ch *)0x3000000000000;
                    local_148 = (char *)(double)*(float *)(create_info[1].pLibraries + uVar9);
                    components.data_.s.str = (Ch *)0x4050000003128e5;
                    components.data_.n = (Number)0x1;
                    _uStack_140 = (Ch *)0x216000000000000;
                    rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                 *)&local_98,&components,
                                (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                 *)&local_148,alloc);
                    local_148 = (char *)(double)*(float *)((long)create_info[1].pLibraries +
                                                          uVar9 * 8 + 4);
                    components.data_.s.str = (Ch *)0x40500000030c579;
                    components.data_.n = (Number)0x1;
                    _uStack_140 = (Ch *)0x216000000000000;
                    rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                 *)&local_98,&components,
                                (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                 *)&local_148,alloc);
                    rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::PushBack(&extent_2,
                               (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                *)&local_98,alloc);
                    uVar9 = uVar9 + 1;
                  } while (uVar9 < *(uint *)&create_info[1].field_0x14);
                  _uStack_140 = (Ch *)0x40500000030c08d;
                  local_148 = (char *)0xf;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember(&extent,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                       *)&local_148,&extent_2,alloc);
                }
                _uStack_140 = (Ch *)0x40500000030c04a;
                local_148 = (char *)0x13;
                value_02 = (StringRefType *)&extent;
                pSVar12 = (StringRefType *)&local_148;
                goto LAB_001439fe;
              }
              goto LAB_00143a06;
            }
            if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT) {
              value.data_.n = (Number)0x0;
              value.data_.s.str = (Ch *)0x3000000000000;
              comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
              comp.data_._8_4_ = 5;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember<VkStructureType>(&value,(StringRefType *)&comp,create_info->sType,alloc);
              local_148._4_1_ = '\0';
              local_148._5_1_ = '\0';
              local_148._6_1_ = '\0';
              local_148._7_1_ = '\0';
              local_148._0_4_ = create_info->libraryCount;
              components.data_.s.str = (Ch *)0x40500000030be54;
              components.data_.n = (Number)0x10;
              _uStack_140 = (ulong)(-1 < (int)create_info->libraryCount) << 0x35 | 0x1d6000000000000
              ;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember(&value,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  *)pSVar12,
                          (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&local_148,alloc);
              local_148._4_1_ = '\0';
              local_148._5_1_ = '\0';
              local_148._6_1_ = '\0';
              local_148._7_1_ = '\0';
              local_148._0_4_ = *(uint *)&create_info->field_0x14;
              components.data_.s.str = (Ch *)0x40500000030be65;
              components.data_.n = (Number)0x10;
              _uStack_140 = (ulong)(-1 < (int)*(uint *)&create_info->field_0x14) << 0x35 |
                            0x1d6000000000000;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember(&value,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  *)pSVar12,
                          (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&local_148,alloc);
              local_148 = "blendOverlap";
              uStack_140 = 0xc;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember<VkBlendOverlapEXT>
                        (&value,(StringRefType *)&local_148,
                         *(VkBlendOverlapEXT *)&create_info->pLibraries,alloc);
              goto LAB_00143a06;
            }
            if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO) {
              value.data_.n = (Number)0x0;
              value.data_.s.str = (Ch *)0x3000000000000;
              comp.data_.n = (Number)0x0;
              comp.data_.s.str = (Ch *)0x4000000000000;
              extent.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
              extent.data_._12_4_ = (undefined4)((ulong)extent.data_.s.str >> 0x20);
              extent.data_._8_4_ = 5;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember<VkStructureType>(&value,(StringRefType *)&extent,create_info->sType,alloc)
              ;
              extent_1.data_.n = (Number)((long)"image format" + 6);
              extent_1.data_._8_4_ = 6;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember<VkFormat>
                        (&value,(StringRefType *)&extent_1,create_info->libraryCount,alloc);
              discardRectangle.data_.n = (Number)anon_var_dwarf_12bde;
              discardRectangle.data_._8_4_ = 10;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember<VkSamplerYcbcrModelConversion>
                        (&value,(StringRefType *)&discardRectangle,
                         *(VkSamplerYcbcrModelConversion *)&create_info->field_0x14,alloc);
              extent_2.data_.n = (Number)anon_var_dwarf_12bea;
              extent_2.data_._8_4_ = 10;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember<VkSamplerYcbcrRange>
                        (&value,(StringRefType *)&extent_2,
                         *(VkSamplerYcbcrRange *)&create_info->pLibraries,alloc);
              local_148 = (char *)(long)*(int *)((long)&create_info->pLibraries + 4);
              uVar7 = 0xb6;
              if (-1 < (long)local_148) {
                uVar7 = 0x1f6;
              }
              _uStack_140 = (ulong)uVar7 << 0x30;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::PushBack(&comp,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                *)&local_148,alloc);
              local_148 = (char *)(long)(int)create_info[1].sType;
              uVar7 = 0xb6;
              if (-1 < (long)local_148) {
                uVar7 = 0x1f6;
              }
              _uStack_140 = (ulong)uVar7 << 0x30;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::PushBack(&comp,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                *)&local_148,alloc);
              local_148 = (char *)(long)*(int *)&create_info[1].field_0x4;
              uVar7 = 0xb6;
              if (-1 < (long)local_148) {
                uVar7 = 0x1f6;
              }
              _uStack_140 = (ulong)uVar7 << 0x30;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::PushBack(&comp,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                *)&local_148,alloc);
              local_148 = (char *)(long)*(int *)&create_info[1].pNext;
              uVar7 = 0xb6;
              if (-1 < (long)local_148) {
                uVar7 = 0x1f6;
              }
              _uStack_140 = (ulong)uVar7 << 0x30;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::PushBack(&comp,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                *)&local_148,alloc);
              _uStack_140 = (Ch *)0x4050000003618f0;
              local_148 = (char *)0xa;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember(&value,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  *)&local_148,&comp,alloc);
              local_98 = "xChromaOffset";
              SStack_90 = 0xd;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember<VkChromaLocation>
                        (&value,(StringRefType *)&local_98,
                         *(VkChromaLocation *)((long)&create_info[1].pNext + 4),alloc);
              local_60.s = "yChromaOffset";
              local_60.length = 0xd;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember<VkChromaLocation>(&value,&local_60,create_info[1].libraryCount,alloc);
              local_70.s = "chromaFilter";
              local_70.length = 0xc;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember<VkFilter>(&value,&local_70,*(VkFilter *)&create_info[1].field_0x14,alloc);
              local_148._4_1_ = '\0';
              local_148._5_1_ = '\0';
              local_148._6_1_ = '\0';
              local_148._7_1_ = '\0';
              local_148._0_4_ = *(uint *)&create_info[1].pLibraries;
              components.data_.s.str = (Ch *)0x40500000030c1cc;
              components.data_.n = (Number)0x1b;
              goto LAB_0014327b;
            }
            if (VVar1 != VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO) {
              if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO) {
                value.data_.n = (Number)0x0;
                value.data_.s.str = (Ch *)0x3000000000000;
                comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                comp.data_._8_4_ = 5;
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::AddMember<VkStructureType>(&value,(StringRefType *)&comp,create_info->sType,alloc)
                ;
                local_148._4_1_ = '\0';
                local_148._5_1_ = '\0';
                local_148._6_1_ = '\0';
                local_148._7_1_ = '\0';
                local_148._0_4_ = create_info->libraryCount;
                components.data_.s.str = (Ch *)0x40500000030bdde;
                components.data_.n = (Number)0x19;
                _uStack_140 = (ulong)(-1 < (int)create_info->libraryCount) << 0x35 |
                              0x1d6000000000000;
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::AddMember(&value,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                    *)pSVar12,
                            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)&local_148,alloc);
                if (create_info->pLibraries == (VkPipeline *)0x0) goto LAB_00143a06;
                extent.data_.n = (Number)0x0;
                extent.data_.s.str = (Ch *)0x4000000000000;
                if (create_info->libraryCount != 0) {
                  uVar9 = 0;
                  do {
                    extent_1.data_.n = (Number)0x0;
                    extent_1.data_.s.str = (Ch *)0x3000000000000;
                    local_148._4_1_ = '\0';
                    local_148._5_1_ = '\0';
                    local_148._6_1_ = '\0';
                    local_148._7_1_ = '\0';
                    local_148._0_4_ = *(uint *)(create_info->pLibraries + uVar9);
                    components.data_.s.str = (Ch *)0x40500000030b5ee;
                    components.data_.n = (Number)0x7;
                    _uStack_140 = (ulong)(-1 < (int)*(uint *)(create_info->pLibraries + uVar9)) <<
                                  0x35 | 0x1d6000000000000;
                    rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::AddMember(&extent_1,
                                (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                 *)pSVar12,
                                (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                 *)&local_148,alloc);
                    uVar2 = *(uint *)((long)create_info->pLibraries + uVar9 * 8 + 4);
                    local_148._4_1_ = '\0';
                    local_148._5_1_ = '\0';
                    local_148._6_1_ = '\0';
                    local_148._7_1_ = '\0';
                    local_148._0_4_ = uVar2;
                    components.data_.s.str = (Ch *)0x40500000030be0e;
                    components.data_.n = (Number)0x7;
                    _uStack_140 = (ulong)(-1 < (int)uVar2) << 0x35 | 0x1d6000000000000;
                    rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::AddMember(&extent_1,
                                (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                 *)pSVar12,
                                (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                 *)&local_148,alloc);
                    rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::PushBack(&extent,&extent_1,alloc);
                    uVar9 = uVar9 + 1;
                  } while (uVar9 < create_info->libraryCount);
                }
                _uStack_140 = (Ch *)0x40500000030bdf8;
                local_148 = (char *)0x15;
LAB_001431f7:
                value_02 = (StringRefType *)&extent;
                pSVar12 = (StringRefType *)&local_148;
LAB_001439fe:
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::AddMember(&value,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                    *)pSVar12,
                            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)value_02,alloc);
              }
              else {
                if (VVar1 == VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE) {
                  components.data_.n = (Number)0x0;
                  components.data_.s.str = (Ch *)0x3000000000000;
                  value.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                  value.data_._8_4_ = 5;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkStructureType>
                            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)pSVar12,(StringRefType *)&value,create_info->sType,alloc);
                  comp.data_.n = (Number)anon_var_dwarf_12a6a;
                  comp.data_._8_4_ = 0x10;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkResolveModeFlagBits>
                            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)pSVar12,(StringRefType *)&comp,create_info->libraryCount,alloc);
                  extent.data_.n = (Number)anon_var_dwarf_12a76;
                  extent.data_._8_4_ = 0x12;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkResolveModeFlagBits>
                            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)pSVar12,(StringRefType *)&extent,
                             *(VkResolveModeFlagBits *)&create_info->field_0x14,alloc);
                  if ((VkAttachmentReference2 *)create_info->pLibraries !=
                      (VkAttachmentReference2 *)0x0) {
                    extent_1.data_.n = (Number)0x0;
                    extent_1.data_.s.str = (Ch *)0x0;
                    out_value_00 = &extent_1;
                    bVar6 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                      ((VkAttachmentReference2 *)create_info->pLibraries,alloc,
                                       out_value_00);
                    if (!bVar6) {
                      return false;
                    }
                    _uStack_140 = (Ch *)0x40500000030bf72;
                    local_148 = (char *)0x1d;
LAB_00141900:
                    rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                 *)pSVar12,
                                (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                 *)&local_148,out_value_00,alloc);
                  }
                  goto LAB_00143d1a;
                }
                if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT) {
                  value.data_.n = (Number)0x0;
                  value.data_.s.str = (Ch *)0x3000000000000;
                  comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                  comp.data_._8_4_ = 5;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkStructureType>
                            (&value,(StringRefType *)&comp,create_info->sType,alloc);
                  extent.data_.n = (Number)0x0;
                  extent.data_.s.str = (Ch *)0x3000000000000;
                  local_148._4_1_ = '\0';
                  local_148._5_1_ = '\0';
                  local_148._6_1_ = '\0';
                  local_148._7_1_ = '\0';
                  local_148._0_4_ = create_info->libraryCount;
                  components.data_.s.str = (Ch *)0x40500000030c27a;
                  components.data_.n = (Number)0xa;
                  _uStack_140 = (ulong)(-1 < (int)create_info->libraryCount) << 0x35 |
                                0x1d6000000000000;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember(&extent,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                       *)pSVar12,
                              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               *)&local_148,alloc);
                  components.data_.n = (Number)((long)"Pipeline layout" + 9);
                  components.data_._8_4_ = 6;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkImageLayout>
                            (&extent,pSVar12,*(VkImageLayout *)&create_info->field_0x14,alloc);
                  _uStack_140 = (Ch *)0x40500000030c25d;
                  local_148 = (char *)0x1c;
                  goto LAB_001431f7;
                }
                if (VVar1 == 
                    VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO) {
                  value.data_.n = (Number)0x0;
                  value.data_.s.str = (Ch *)0x3000000000000;
                  comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                  comp.data_._8_4_ = 5;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkStructureType>
                            (&value,(StringRefType *)&comp,create_info->sType,alloc);
                  local_148._4_1_ = '\0';
                  local_148._5_1_ = '\0';
                  local_148._6_1_ = '\0';
                  local_148._7_1_ = '\0';
                  local_148._0_4_ = create_info->libraryCount;
                  components.data_.s.str = (Ch *)0x40500000030bf03;
                  components.data_.n = (Number)0x14;
                  goto LAB_0014327b;
                }
                if (VVar1 == VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR) {
                  value.data_.n = (Number)0x0;
                  value.data_.s.str = (Ch *)0x3000000000000;
                  comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                  comp.data_._8_4_ = 5;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkStructureType>
                            (&value,(StringRefType *)&comp,create_info->sType,alloc);
                  extent.data_.n = (Number)0x0;
                  extent.data_.s.str = (Ch *)0x3000000000000;
                  local_148._4_1_ = '\0';
                  local_148._5_1_ = '\0';
                  local_148._6_1_ = '\0';
                  local_148._7_1_ = '\0';
                  local_148._0_4_ = *(uint *)&create_info->pLibraries;
                  components.data_.s.str = (Ch *)0x405000000348278;
                  components.data_.n = (Number)0x5;
                  _uStack_140 = (ulong)(-1 < (int)*(uint *)&create_info->pLibraries) << 0x35 |
                                0x1d6000000000000;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember(&extent,&components,
                              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               *)&local_148,alloc);
                  uVar2 = *(uint *)((long)&create_info->pLibraries + 4);
                  local_148._4_1_ = '\0';
                  local_148._5_1_ = '\0';
                  local_148._6_1_ = '\0';
                  local_148._7_1_ = '\0';
                  local_148._0_4_ = uVar2;
                  components.data_.s.str = (Ch *)0x40500000030bc82;
                  components.data_.n = (Number)0x6;
                  _uStack_140 = (ulong)(-1 < (int)uVar2) << 0x35 | 0x1d6000000000000;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember(&extent,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                       *)&components,
                              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               *)&local_148,alloc);
                  _uStack_140 = (Ch *)0x40500000030bf90;
                  local_148 = (char *)0x1e;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember(&value,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                      *)&local_148,&extent,alloc);
                  if (*(VkAttachmentReference2 **)&create_info->libraryCount !=
                      (VkAttachmentReference2 *)0x0) {
                    components.data_.n = (Number)0x0;
                    components.data_.s.str = (Ch *)0x0;
                    bVar6 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                      (*(VkAttachmentReference2 **)&create_info->libraryCount,alloc,
                                       &components);
                    if (!bVar6) {
                      return false;
                    }
                    _uStack_140 = (Ch *)0x40500000030bfaf;
                    local_148 = (char *)0x1d;
                    value_02 = (StringRefType *)&components;
                    pSVar12 = (StringRefType *)&local_148;
                    goto LAB_001439fe;
                  }
                }
                else if (VVar1 == 
                         VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR) {
                  value.data_.n = (Number)0x0;
                  value.data_.s.str = (Ch *)0x3000000000000;
                  comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                  comp.data_._8_4_ = 5;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkStructureType>
                            (&value,(StringRefType *)&comp,create_info->sType,alloc);
                  if ((dynamic_state_info != (DynamicStateInfo *)0x0) &&
                     (dynamic_state_info->fragment_shading_rate == false)) {
                    extent.data_.n = (Number)0x0;
                    extent.data_.s.str = (Ch *)0x3000000000000;
                    local_148._4_1_ = '\0';
                    local_148._5_1_ = '\0';
                    local_148._6_1_ = '\0';
                    local_148._7_1_ = '\0';
                    local_148._0_4_ = create_info->libraryCount;
                    components.data_.s.str = (Ch *)0x405000000348278;
                    components.data_.n = (Number)0x5;
                    _uStack_140 = (ulong)(-1 < (int)create_info->libraryCount) << 0x35 |
                                  0x1d6000000000000;
                    rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                 *)&extent,&components,
                                (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                 *)&local_148,alloc);
                    local_148._4_1_ = '\0';
                    local_148._5_1_ = '\0';
                    local_148._6_1_ = '\0';
                    local_148._7_1_ = '\0';
                    local_148._0_4_ = *(uint *)&create_info->field_0x14;
                    components.data_.s.str = (Ch *)0x40500000030bc82;
                    components.data_.n = (Number)0x6;
                    _uStack_140 = (ulong)(-1 < (int)*(uint *)&create_info->field_0x14) << 0x35 |
                                  0x1d6000000000000;
                    rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::AddMember(&extent,&components,
                                (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                 *)&local_148,alloc);
                    _uStack_140 = (Ch *)0x40500000030c174;
                    local_148 = (char *)0xc;
                    rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::AddMember(&value,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                        *)&local_148,&extent,alloc);
                    components.data_.n = (Number)0x0;
                    components.data_.s.str = (Ch *)0x4000000000000;
                    lVar10 = 0;
                    bVar6 = true;
                    do {
                      bVar8 = bVar6;
                      local_148 = (char *)(long)*(int *)((long)&create_info->pLibraries + lVar10 * 4
                                                        );
                      uVar7 = 0xb6;
                      if (-1 < (long)local_148) {
                        uVar7 = 0x1f6;
                      }
                      _uStack_140 = (ulong)uVar7 << 0x30;
                      rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::PushBack(&components,
                                 (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  *)&local_148,alloc);
                      lVar10 = 1;
                      bVar6 = false;
                    } while (bVar8);
                    _uStack_140 = (Ch *)0x40500000030c181;
                    local_148 = (char *)0xb;
                    rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::AddMember(&value,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                        *)&local_148,&components,alloc);
                  }
                }
                else if (VVar1 == VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_LOCATION_INFO) {
                  value.data_.n = (Number)0x0;
                  value.data_.s.str = (Ch *)0x3000000000000;
                  comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                  comp.data_._8_4_ = 5;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkStructureType>
                            (&value,(StringRefType *)&comp,create_info->sType,alloc);
                  local_148._4_1_ = '\0';
                  local_148._5_1_ = '\0';
                  local_148._6_1_ = '\0';
                  local_148._7_1_ = '\0';
                  local_148._0_4_ = create_info->libraryCount;
                  components.data_.s.str = (Ch *)0x40500000030c2f2;
                  components.data_.n = (Number)0x14;
                  _uStack_140 = (ulong)(-1 < (int)create_info->libraryCount) << 0x35 |
                                0x1d6000000000000;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember(&value,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                      *)pSVar12,
                              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               *)&local_148,alloc);
                  if (create_info->pLibraries != (VkPipeline *)0x0) {
                    components.data_.n = (Number)0x0;
                    components.data_.s.str = (Ch *)0x4000000000000;
                    if (create_info->libraryCount != 0) {
                      uVar9 = 0;
                      do {
                        uVar2 = *(uint *)((long)create_info->pLibraries + uVar9 * 4);
                        local_148._4_1_ = '\0';
                        local_148._5_1_ = '\0';
                        local_148._6_1_ = '\0';
                        local_148._7_1_ = '\0';
                        local_148._0_4_ = uVar2;
                        _uStack_140 = (ulong)(-1 < (int)uVar2) << 0x35 | 0x1d6000000000000;
                        rapidjson::
                        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                    *)pSVar12,
                                   (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                    *)&local_148,alloc);
                        uVar9 = uVar9 + 1;
                      } while (uVar9 < create_info->libraryCount);
                    }
                    _uStack_140 = (Ch *)0x40500000030c307;
                    local_148 = (char *)0x18;
                    goto LAB_0014164a;
                  }
                }
                else {
                  if (VVar1 != VK_STRUCTURE_TYPE_RENDERING_INPUT_ATTACHMENT_INDEX_INFO) {
                    if (VVar1 == VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT) {
                      local_148 = (char *)0x0;
                      _uStack_140 = (Ch *)0x3000000000000;
                      components.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                      components.data_._8_4_ = 5;
                      rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::AddMember<VkStructureType>
                                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  *)&local_148,pSVar12,create_info->sType,alloc);
                      value.data_.n = (Number)anon_var_dwarf_12a5e;
                      value.data_._8_4_ = 0xd;
                      value_00 = create_info->libraryCount;
                      pSVar12 = (StringRefType *)&value;
                    }
                    else {
                      if (VVar1 != VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT) {
                        if (VVar1 == 
                            VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT
                           ) {
                          local_148 = (char *)0x0;
                          _uStack_140 = (Ch *)0x3000000000000;
                          components.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                          components.data_._8_4_ = 5;
                          rapidjson::
                          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ::AddMember<VkStructureType>
                                    ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                      *)&local_148,pSVar12,create_info->sType,alloc);
                          value.data_.n = (Number)anon_var_dwarf_12b2a;
                          value.data_._8_4_ = 0x13;
                          rapidjson::
                          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ::AddMember<VkProvokingVertexModeEXT>
                                    ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                      *)&local_148,(StringRefType *)&value,create_info->libraryCount
                                     ,alloc);
                          goto LAB_00143ade;
                        }
                        if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO
                           ) {
                          value.data_.n = (Number)0x0;
                          value.data_.s.str = (Ch *)0x3000000000000;
                          comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                          comp.data_._8_4_ = 5;
                          rapidjson::
                          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ::AddMember<VkStructureType>
                                    (&value,(StringRefType *)&comp,create_info->sType,alloc);
                          extent.data_.n = (Number)anon_var_dwarf_12a0a;
                          extent.data_._8_4_ = 0x15;
                          rapidjson::
                          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ::AddMember<VkLineRasterizationMode>
                                    (&value,(StringRefType *)&extent,create_info->libraryCount,alloc
                                    );
                          local_148._4_1_ = '\0';
                          local_148._5_1_ = '\0';
                          local_148._6_1_ = '\0';
                          local_148._7_1_ = '\0';
                          local_148._0_4_ = *(uint *)&create_info->field_0x14;
                          components.data_.s.str = (Ch *)0x40500000030becb;
                          components.data_.n = (Number)0x12;
                          _uStack_140 = (ulong)(-1 < (int)*(uint *)&create_info->field_0x14) << 0x35
                                        | 0x1d6000000000000;
                          rapidjson::
                          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ::AddMember(&value,&components,
                                      (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                       *)&local_148,alloc);
                          local_148._4_1_ = '\0';
                          local_148._5_1_ = '\0';
                          local_148._6_1_ = '\0';
                          local_148._7_1_ = '\0';
                          local_148._0_4_ = *(uint *)&create_info->pLibraries;
                          components.data_.s.str = (Ch *)0x40500000030bede;
                          components.data_.n = (Number)0x11;
                          _uStack_140 = (ulong)(-1 < (int)*(uint *)&create_info->pLibraries) << 0x35
                                        | 0x1d6000000000000;
                          rapidjson::
                          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ::AddMember(&value,&components,
                                      (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                       *)&local_148,alloc);
                          local_148._2_6_ = 0;
                          local_148._0_2_ = *(ushort *)((long)&create_info->pLibraries + 4);
                          components.data_.s.str = (Ch *)0x40500000030bef0;
                          components.data_.n = (Number)0x12;
                          _uStack_140 = (Ch *)0x1f6000000000000;
                        }
                        else {
                          if (VVar1 == VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT) {
                            value.data_.n = (Number)0x0;
                            value.data_.s.str = (Ch *)0x3000000000000;
                            comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                            comp.data_._8_4_ = 5;
                            rapidjson::
                            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            ::AddMember<VkStructureType>
                                      (&value,(StringRefType *)&comp,create_info->sType,alloc);
                            extent.data_.n = (Number)anon_var_dwarf_12cb6;
                            extent.data_._8_4_ = 0x17;
                            rapidjson::
                            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            ::AddMember<VkDepthBiasRepresentationEXT>
                                      (&value,(StringRefType *)&extent,create_info->libraryCount,
                                       alloc);
                            local_148._4_1_ = '\0';
                            local_148._5_1_ = '\0';
                            local_148._6_1_ = '\0';
                            local_148._7_1_ = '\0';
                            local_148._0_4_ = *(uint *)&create_info->field_0x14;
                            components.data_.s.str = (Ch *)0x40500000030c236;
                            components.data_.n = (Number)0xe;
                            goto LAB_0014327b;
                          }
                          if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_CUSTOM_BORDER_COLOR_CREATE_INFO_EXT
                             ) {
                            components.data_.n = (Number)0x0;
                            components.data_.s.str = (Ch *)0x3000000000000;
                            value.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                            value.data_._8_4_ = 5;
                            rapidjson::
                            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            ::AddMember<VkStructureType>
                                      ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                        *)pSVar12,(StringRefType *)&value,create_info->sType,alloc);
                            comp.data_.n = (Number)0x0;
                            comp.data_.s.str = (Ch *)0x4000000000000;
                            lVar10 = 0;
                            do {
                              local_148._4_1_ = '\0';
                              local_148._5_1_ = '\0';
                              local_148._6_1_ = '\0';
                              local_148._7_1_ = '\0';
                              local_148._0_4_ = (&create_info->libraryCount)[lVar10];
                              _uStack_140 = (ulong)(-1 < (int)(&create_info->libraryCount)[lVar10])
                                            << 0x35 | 0x1d6000000000000;
                              rapidjson::
                              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              ::PushBack(&comp,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                *)&local_148,alloc);
                              lVar10 = lVar10 + 1;
                            } while (lVar10 != 4);
                            _uStack_140 = (Ch *)0x40500000030c0b1;
                            local_148 = (char *)0x11;
                            rapidjson::
                            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                         *)pSVar12,
                                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                         *)&local_148,&comp,alloc);
                            local_148 = (char *)((long)"image format" + 6);
                            uStack_140 = 6;
                            rapidjson::
                            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            ::AddMember<VkFormat>
                                      ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                        *)pSVar12,(StringRefType *)&local_148,create_info[1].sType,
                                       alloc);
                            next.data_.s.length = components.data_.s.length;
                            next.data_.s.hashcode = components.data_.s.hashcode;
                            next.data_._8_4_ = components.data_._8_4_;
                            next.data_._12_4_ = components.data_._12_4_;
LAB_001430d3:
                            goto LAB_00143d24;
                          }
                          if (VVar1 == VK_STRUCTURE_TYPE_MEMORY_BARRIER_2) {
                            local_148 = (char *)0x0;
                            _uStack_140 = (Ch *)0x3000000000000;
                            components.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                            components.data_._8_4_ = 5;
                            rapidjson::
                            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            ::AddMember<VkStructureType>
                                      ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                        *)&local_148,pSVar12,create_info->sType,alloc);
                            value.data_.n = (Number)anon_var_dwarf_12b8a;
                            value.data_._8_4_ = 0xc;
                            rapidjson::
                            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            ::AddMember<unsigned_long>
                                      ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                        *)&local_148,(StringRefType *)&value,
                                       *(unsigned_long *)&create_info->libraryCount,alloc);
                            comp.data_.n = (Number)anon_var_dwarf_12b96;
                            comp.data_._8_4_ = 0xd;
                            rapidjson::
                            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            ::AddMember<unsigned_long>
                                      ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                        *)&local_148,(StringRefType *)&comp,
                                       (unsigned_long)create_info->pLibraries,alloc);
                            extent.data_.n = (Number)anon_var_dwarf_12ba2;
                            extent.data_._8_4_ = 0xc;
                            rapidjson::
                            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            ::AddMember<unsigned_long>
                                      ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                        *)&local_148,(StringRefType *)&extent,
                                       *(unsigned_long *)(create_info + 1),alloc);
                            extent_1.data_.n = (Number)anon_var_dwarf_12bae;
                            extent_1.data_._8_4_ = 0xd;
                            value_01 = create_info[1].pNext;
                            pSVar12 = (StringRefType *)&extent_1;
LAB_001426b8:
                            rapidjson::
                            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            ::AddMember<unsigned_long>
                                      ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                        *)&local_148,pSVar12,(unsigned_long)value_01,alloc);
                            goto LAB_00143ade;
                          }
                          if (VVar1 == VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT)
                          {
                            value.data_.n = (Number)0x0;
                            value.data_.s.str = (Ch *)0x3000000000000;
                            comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                            comp.data_._8_4_ = 5;
                            rapidjson::
                            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            ::AddMember<VkStructureType>
                                      (&value,(StringRefType *)&comp,create_info->sType,alloc);
                            local_148._4_1_ = '\0';
                            local_148._5_1_ = '\0';
                            local_148._6_1_ = '\0';
                            local_148._7_1_ = '\0';
                            local_148._0_4_ = create_info->libraryCount;
                            components.data_.s.str = (Ch *)0x4050000003138c6;
                            components.data_.n = (Number)0x5;
                            _uStack_140 = (ulong)(-1 < (int)create_info->libraryCount) << 0x35 |
                                          0x1d6000000000000;
                            goto LAB_001439fb;
                          }
                          if (VVar1 == VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT) {
                            components.data_.n = (Number)0x0;
                            components.data_.s.str = (Ch *)0x3000000000000;
                            value.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                            value.data_._8_4_ = 5;
                            rapidjson::
                            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            ::AddMember<VkStructureType>
                                      ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                        *)pSVar12,(StringRefType *)&value,create_info->sType,alloc);
                            comp.data_.n = (Number)0x0;
                            comp.data_.s.str = (Ch *)0x4000000000000;
                            if (create_info->libraryCount != 0) {
                              uVar9 = 0;
                              do {
                                extent.data_.n = (Number)0x0;
                                extent.data_.s.str = (Ch *)0x4000000000000;
                                if (*(int *)(create_info->pLibraries + uVar9 * 2) != 0) {
                                  ppVVar11 = create_info->pLibraries + uVar9 * 2;
                                  uVar13 = 0;
                                  do {
                                    local_148 = (char *)(long)*(int *)(ppVVar11[1] + uVar13 * 4);
                                    uVar7 = 0x1f6;
                                    if ((long)local_148 < 0) {
                                      uVar7 = 0xb6;
                                    }
                                    _uStack_140 = (ulong)uVar7 << 0x30;
                                    rapidjson::
                                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                    ::PushBack(&extent,(
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  *)&local_148,alloc);
                                    uVar13 = uVar13 + 1;
                                  } while (uVar13 < *(uint *)ppVVar11);
                                }
                                rapidjson::
                                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                ::PushBack(&comp,&extent,alloc);
                                uVar9 = uVar9 + 1;
                              } while (uVar9 < create_info->libraryCount);
                            }
                            out_value_00 = &comp;
                            _uStack_140 = (Ch *)0x40500000030c372;
                            local_148 = (char *)0x1a;
                            goto LAB_00141900;
                          }
                          if (VVar1 == 
                              VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT
                             ) {
                            value.data_.n = (Number)0x0;
                            value.data_.s.str = (Ch *)0x3000000000000;
                            comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                            comp.data_._8_4_ = 5;
                            rapidjson::
                            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            ::AddMember<VkStructureType>
                                      (&value,(StringRefType *)&comp,create_info->sType,alloc);
                            local_148._4_1_ = '\0';
                            local_148._5_1_ = '\0';
                            local_148._6_1_ = '\0';
                            local_148._7_1_ = '\0';
                            local_148._0_4_ = create_info->libraryCount;
                            components.data_.s.str = (Ch *)0x40500000030c1e8;
                            components.data_.n = (Number)0x10;
                          }
                          else {
                            if (VVar1 != 
                                VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT) {
                              if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT) {
                                value.data_.n = (Number)0x0;
                                value.data_.s.str = (Ch *)0x3000000000000;
                                comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                                comp.data_._8_4_ = 5;
                                rapidjson::
                                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                ::AddMember<VkStructureType>
                                          (&value,(StringRefType *)&comp,create_info->sType,alloc);
                                local_148._4_1_ = '\0';
                                local_148._5_1_ = '\0';
                                local_148._6_1_ = '\0';
                                local_148._7_1_ = '\0';
                                local_148._0_4_ = create_info->libraryCount;
                                components.data_.s.str = (Ch *)0x40500000030c012;
                                components.data_.n = (Number)0xf;
                                _uStack_140 = (ulong)(-1 < (int)create_info->libraryCount) << 0x35 |
                                              0x1d6000000000000;
                                rapidjson::
                                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                ::AddMember(&value,(
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  *)pSVar12,
                                            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                             *)&local_148,alloc);
                                if (dynamic_state_info == (DynamicStateInfo *)0x0) {
                                  return false;
                                }
                                if ((create_info->pLibraries == (VkPipeline *)0x0) ||
                                   (dynamic_state_info->color_write_enable != false))
                                goto LAB_00143a06;
                                components.data_.n = (Number)0x0;
                                components.data_.s.str = (Ch *)0x4000000000000;
                                if (create_info->libraryCount != 0) {
                                  uVar9 = 0;
                                  do {
                                    uVar2 = *(uint *)((long)create_info->pLibraries + uVar9 * 4);
                                    local_148._4_1_ = '\0';
                                    local_148._5_1_ = '\0';
                                    local_148._6_1_ = '\0';
                                    local_148._7_1_ = '\0';
                                    local_148._0_4_ = uVar2;
                                    _uStack_140 = (ulong)(-1 < (int)uVar2) << 0x35 |
                                                  0x1d6000000000000;
                                    rapidjson::
                                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                    ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                *)pSVar12,
                                               (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                *)&local_148,alloc);
                                    uVar9 = uVar9 + 1;
                                  } while (uVar9 < create_info->libraryCount);
                                }
                                _uStack_140 = (Ch *)0x40500000030c022;
                                local_148 = (char *)0x11;
                                rapidjson::
                                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                ::AddMember(&value,(
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  *)&local_148,
                                            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                             *)pSVar12,alloc);
                                next.data_.s.length = value.data_.s.length;
                                next.data_.s.hashcode = value.data_.s.hashcode;
                                next.data_._8_4_ = value.data_._8_4_;
                                next.data_._12_4_ = value.data_._12_4_;
                                goto LAB_001430d3;
                              }
                              if (VVar1 == 
                                  VK_STRUCTURE_TYPE_SAMPLER_BORDER_COLOR_COMPONENT_MAPPING_CREATE_INFO_EXT
                                 ) {
                                value.data_.n = (Number)0x0;
                                value.data_.s.str = (Ch *)0x3000000000000;
                                comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                                comp.data_._8_4_ = 5;
                                rapidjson::
                                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                ::AddMember<VkStructureType>
                                          (&value,(StringRefType *)&comp,create_info->sType,alloc);
                                local_148._4_1_ = '\0';
                                local_148._5_1_ = '\0';
                                local_148._6_1_ = '\0';
                                local_148._7_1_ = '\0';
                                local_148._0_4_ = create_info[1].sType;
                                components.data_.s.str = (Ch *)0x40500000030c209;
                                components.data_.n = (Number)0x4;
                                _uStack_140 = (ulong)(-1 < (int)create_info[1].sType) << 0x35 |
                                              0x1d6000000000000;
                                rapidjson::
                                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                ::AddMember(&value,(
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  *)pSVar12,
                                            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                             *)&local_148,alloc);
                                components.data_.n = (Number)0x0;
                                components.data_.s.str = (Ch *)0x3000000000000;
                                extent.data_.n = (Number)((long)"AtomicOr" + 7);
                                extent.data_._8_4_ = 1;
                                rapidjson::
                                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                ::AddMember<VkComponentSwizzle>
                                          ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                            *)pSVar12,(StringRefType *)&extent,
                                           create_info->libraryCount,alloc);
                                extent_1.data_.n =
                                     (Number)((long)"data_.f.flags & kUint64Flag" + 0x1a);
                                extent_1.data_._8_4_ = 1;
                                rapidjson::
                                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                ::AddMember<VkComponentSwizzle>
                                          ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                            *)pSVar12,(StringRefType *)&extent_1,
                                           *(VkComponentSwizzle *)&create_info->field_0x14,alloc);
                                discardRectangle.data_.n = (Number)((long)"r+b" + 2);
                                discardRectangle.data_._8_4_ = 1;
                                rapidjson::
                                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                ::AddMember<VkComponentSwizzle>
                                          ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                            *)pSVar12,(StringRefType *)&discardRectangle,
                                           *(VkComponentSwizzle *)&create_info->pLibraries,alloc);
                                extent_2.data_.n = (Number)((long)"gfx-rs community Naga" + 0x14);
                                extent_2.data_._8_4_ = 1;
                                rapidjson::
                                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                ::AddMember<VkComponentSwizzle>
                                          ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                            *)pSVar12,(StringRefType *)&extent_2,
                                           *(VkComponentSwizzle *)
                                            ((long)&create_info->pLibraries + 4),alloc);
                                _uStack_140 = (Ch *)0x4050000003618f0;
                                local_148 = (char *)0xa;
                                value_02 = pSVar12;
                                pSVar12 = (StringRefType *)&local_148;
                              }
                              else {
                                if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT) {
                                  value.data_.n = (Number)0x0;
                                  value.data_.s.str = (Ch *)0x3000000000000;
                                  comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                                  comp.data_._8_4_ = 5;
                                  rapidjson::
                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  ::AddMember<VkStructureType>
                                            (&value,(StringRefType *)&comp,create_info->sType,alloc)
                                  ;
                                  local_148._4_1_ = '\0';
                                  local_148._5_1_ = '\0';
                                  local_148._6_1_ = '\0';
                                  local_148._7_1_ = '\0';
                                  local_148._0_4_ = create_info->libraryCount;
                                  components.data_.s.str = (Ch *)0x40500000030c1f9;
                                  components.data_.n = (Number)0xf;
                                  goto LAB_0014327b;
                                }
                                if (VVar1 == 
                                    VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT
                                   ) goto LAB_00143d39;
                                if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO)
                                {
                                  local_148 = (char *)0x0;
                                  _uStack_140 = (Ch *)0x3000000000000;
                                  components.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                                  components.data_._8_4_ = 5;
                                  rapidjson::
                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  ::AddMember<VkStructureType>
                                            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                              *)&local_148,pSVar12,create_info->sType,alloc);
                                  value.data_.n =
                                       (Number)((long)
                                                "Unknown flag \'--%s\'. Use --help for a list of valid flags"
                                               + 0x34);
                                  value.data_._8_4_ = 5;
                                  pSVar12 = (StringRefType *)&value;
                                  value_01 = *(void **)&create_info->libraryCount;
                                  goto LAB_001426b8;
                                }
                                if (VVar1 != 
                                    VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT
                                   ) {
                                  if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR) {
                                    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)&local_50,
                                               "Unsupported pNext found, cannot hash sType.","");
                                    log_error_pnext_chain(&local_50,create_info);
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_50._M_dataplus._M_p != &local_50.field_2) {
                                      operator_delete(local_50._M_dataplus._M_p,
                                                      local_50.field_2._M_allocated_capacity + 1);
                                    }
                                    return false;
                                  }
                                  bVar6 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                    (create_info,alloc,true,&next);
                                  if (!bVar6) {
                                    return false;
                                  }
                                  goto LAB_00143d24;
                                }
                                value.data_.n = (Number)0x0;
                                value.data_.s.str = (Ch *)0x3000000000000;
                                comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                                comp.data_._8_4_ = 5;
                                rapidjson::
                                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                ::AddMember<VkStructureType>
                                          (&value,(StringRefType *)&comp,create_info->sType,alloc);
                                extent.data_.n = (Number)anon_var_dwarf_12d0a;
                                extent.data_._8_4_ = 0xe;
                                rapidjson::
                                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                ::AddMember<VkDepthClampModeEXT>
                                          (&value,(StringRefType *)&extent,create_info->libraryCount
                                           ,alloc);
                                if (create_info->pLibraries == (VkPipeline *)0x0) goto LAB_00143a06;
                                extent_1.data_.n = (Number)0x0;
                                extent_1.data_.s.str = (Ch *)0x3000000000000;
                                local_148 = (char *)(double)*(float *)create_info->pLibraries;
                                components.data_.s.str = (Ch *)0x40500000030c2d6;
                                components.data_.n = (Number)0xd;
                                _uStack_140 = (Ch *)0x216000000000000;
                                rapidjson::
                                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                             *)&extent_1,
                                            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                             *)pSVar12,
                                            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                             *)&local_148,alloc);
                                local_148 = (char *)(double)*(float *)((long)create_info->pLibraries
                                                                      + 4);
                                components.data_.s.str = (Ch *)0x40500000030c2e4;
                                components.data_.n = (Number)0xd;
                                _uStack_140 = (Ch *)0x216000000000000;
                                rapidjson::
                                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                             *)&extent_1,
                                            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                             *)pSVar12,
                                            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                             *)&local_148,alloc);
                                _uStack_140 = (Ch *)0x40500000030c2c6;
                                local_148 = (char *)0xf;
                                value_02 = (StringRefType *)&extent_1;
                                pSVar12 = (StringRefType *)&local_148;
                              }
                              goto LAB_001439fe;
                            }
                            value.data_.n = (Number)0x0;
                            value.data_.s.str = (Ch *)0x3000000000000;
                            comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                            comp.data_._8_4_ = 5;
                            rapidjson::
                            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            ::AddMember<VkStructureType>
                                      (&value,(StringRefType *)&comp,create_info->sType,alloc);
                            extent.data_.n = (Number)anon_var_dwarf_1277e;
                            extent.data_._8_4_ = 0x14;
                            rapidjson::
                            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            ::AddMember<VkSampleCountFlagBits>
                                      (&value,(StringRefType *)&extent,
                                       *(VkSampleCountFlagBits *)&create_info->field_0x14,alloc);
                            local_148._4_1_ = '\0';
                            local_148._5_1_ = '\0';
                            local_148._6_1_ = '\0';
                            local_148._7_1_ = '\0';
                            local_148._0_4_ = create_info->libraryCount;
                            components.data_.s.str = (Ch *)0x40500000030c20e;
                            components.data_.n = (Number)0x27;
                          }
LAB_0014327b:
                          _uStack_140 = (ulong)(-1 < (int)local_148) << 0x35 | 0x1d6000000000000;
                        }
LAB_001439fb:
                        value_02 = (StringRefType *)&local_148;
                        pSVar12 = (StringRefType *)&components;
                        goto LAB_001439fe;
                      }
                      local_148 = (char *)0x0;
                      _uStack_140 = (Ch *)0x3000000000000;
                      components.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                      components.data_._8_4_ = 5;
                      rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::AddMember<VkStructureType>
                                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  *)&local_148,pSVar12,create_info->sType,alloc);
                      value.data_.n = (Number)anon_var_dwarf_12a46;
                      value.data_._8_4_ = 0x14;
                      rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::AddMember<VkImageLayout>
                                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  *)&local_148,(StringRefType *)&value,create_info->libraryCount,
                                 alloc);
                      comp.data_.n = (Number)anon_var_dwarf_12a52;
                      comp.data_._8_4_ = 0x12;
                      value_00 = *(VkImageLayout *)&create_info->field_0x14;
                      pSVar12 = (StringRefType *)&comp;
                    }
                    rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::AddMember<VkImageLayout>
                              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                *)&local_148,pSVar12,value_00,alloc);
                    goto LAB_00143ade;
                  }
                  value.data_.n = (Number)0x0;
                  value.data_.s.str = (Ch *)0x3000000000000;
                  comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                  comp.data_._8_4_ = 5;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkStructureType>
                            (&value,(StringRefType *)&comp,create_info->sType,alloc);
                  local_148._4_1_ = '\0';
                  local_148._5_1_ = '\0';
                  local_148._6_1_ = '\0';
                  local_148._7_1_ = '\0';
                  local_148._0_4_ = create_info->libraryCount;
                  components.data_.s.str = (Ch *)0x40500000030c2f2;
                  components.data_.n = (Number)0x14;
                  _uStack_140 = (ulong)(-1 < (int)create_info->libraryCount) << 0x35 |
                                0x1d6000000000000;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember(&value,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                      *)pSVar12,
                              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               *)&local_148,alloc);
                  if (create_info->pLibraries != (VkPipeline *)0x0) {
                    components.data_.n = (Number)0x0;
                    components.data_.s.str = (Ch *)0x4000000000000;
                    if (create_info->libraryCount != 0) {
                      uVar9 = 0;
                      do {
                        uVar2 = *(uint *)((long)create_info->pLibraries + uVar9 * 4);
                        local_148._4_1_ = '\0';
                        local_148._5_1_ = '\0';
                        local_148._6_1_ = '\0';
                        local_148._7_1_ = '\0';
                        local_148._0_4_ = uVar2;
                        _uStack_140 = (ulong)(-1 < (int)uVar2) << 0x35 | 0x1d6000000000000;
                        rapidjson::
                        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                    *)pSVar12,
                                   (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                    *)&local_148,alloc);
                        uVar9 = uVar9 + 1;
                      } while (uVar9 < create_info->libraryCount);
                    }
                    _uStack_140 = (Ch *)0x40500000030c320;
                    local_148 = (char *)0x1b;
                    rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::AddMember(&value,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                        *)&local_148,
                                (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                 *)pSVar12,alloc);
                  }
                  if (*(uint **)(create_info + 1) != (uint *)0x0) {
                    uVar2 = **(uint **)(create_info + 1);
                    local_148._4_1_ = '\0';
                    local_148._5_1_ = '\0';
                    local_148._6_1_ = '\0';
                    local_148._7_1_ = '\0';
                    local_148._0_4_ = uVar2;
                    components.data_.s.str = (Ch *)0x40500000030c33c;
                    components.data_.n = (Number)0x19;
                    _uStack_140 = (ulong)(-1 < (int)uVar2) << 0x35 | 0x1d6000000000000;
                    rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::AddMember(&value,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                        *)pSVar12,
                                (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                 *)&local_148,alloc);
                  }
                  if ((uint *)create_info[1].pNext != (uint *)0x0) {
                    uVar2 = *create_info[1].pNext;
                    local_148._4_1_ = '\0';
                    local_148._5_1_ = '\0';
                    local_148._6_1_ = '\0';
                    local_148._7_1_ = '\0';
                    local_148._0_4_ = uVar2;
                    components.data_.s.str = (Ch *)0x40500000030c356;
                    components.data_.n = (Number)0x1b;
                    _uStack_140 = (ulong)(-1 < (int)uVar2) << 0x35 | 0x1d6000000000000;
                    goto LAB_001439fb;
                  }
                }
              }
              goto LAB_00143a06;
            }
            components.data_.n = (Number)0x0;
            components.data_.s.str = (Ch *)0x3000000000000;
            value.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
            value.data_._8_4_ = 5;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<VkStructureType>
                      ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)pSVar12,(StringRefType *)&value,create_info->sType,alloc);
            if (create_info->libraryCount != 0) {
              comp.data_.n = (Number)0x0;
              comp.data_.s.str = (Ch *)0x4000000000000;
              uVar9 = 0;
              do {
                uVar2 = *(uint *)((long)create_info->pLibraries + uVar9 * 4);
                local_148._4_1_ = '\0';
                local_148._5_1_ = '\0';
                local_148._6_1_ = '\0';
                local_148._7_1_ = '\0';
                local_148._0_4_ = uVar2;
                _uStack_140 = (ulong)(-1 < (int)uVar2) << 0x35 | 0x1d6000000000000;
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::PushBack(&comp,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  *)&local_148,alloc);
                uVar9 = uVar9 + 1;
              } while (uVar9 < create_info->libraryCount);
              _uStack_140 = (Ch *)0x40500000030be3a;
              local_148 = (char *)0xc;
              goto LAB_00143d06;
            }
LAB_00143d1a:
            next.data_.s.length = components.data_.s.length;
            uVar14 = components.data_.s.hashcode;
            next.data_._8_4_ = components.data_._8_4_;
            next.data_._12_4_ = components.data_._12_4_;
          }
        }
        next.data_._4_1_ = (char)uVar14;
        next.data_._5_1_ = SUB41(uVar14,1);
        next.data_._6_1_ = SUB41(uVar14,2);
        next.data_._7_1_ = SUB41(uVar14,3);
      }
LAB_00143d24:
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_88.s,&next,alloc);
      uVar4 = components.data_.s.str;
      uVar5 = comp.data_.s.str;
    }
LAB_00143d39:
    comp.data_.s.str = (Ch *)uVar5;
    components.data_.s.str = (Ch *)uVar4;
    create_info = (VkPipelineLibraryCreateInfoKHR *)
                  pnext_chain_skip_ignored_entries(create_info->pNext);
    uVar4 = components.data_.s.str;
    uVar3 = value.data_.s.str;
    uVar5 = comp.data_.s.str;
  } while( true );
}

Assistant:

static bool pnext_chain_json_value(const void *pNext, Allocator &alloc, Value *out_value,
                                   const DynamicStateInfo *dynamic_state_info)
{
	Value nexts(kArrayType);

	while ((pNext = pnext_chain_skip_ignored_entries(pNext)) != nullptr)
	{
		auto *pin = static_cast<const VkBaseInStructure *>(pNext);
		bool ignored = false;
		Value next;

		switch (pin->sType)
		{
		case VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO:
			if (!json_value(*static_cast<const VkPipelineTessellationDomainOriginStateCreateInfo *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO_KHR:
			if (!json_value(*static_cast<const VkPipelineVertexInputDivisorStateCreateInfoKHR *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineRasterizationDepthClipStateCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_STREAM_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineRasterizationStateStreamCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO:
			if (!json_value(*static_cast<const VkRenderPassMultiviewCreateInfo *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkDescriptorSetLayoutBindingFlagsCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineColorBlendAdvancedStateCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineRasterizationConservativeStateCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO_KHR:
			if (!json_value(*static_cast<const VkPipelineRasterizationLineStateCreateInfoKHR *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkMutableDescriptorTypeCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT:
			if (!json_value(*static_cast<const VkAttachmentDescriptionStencilLayout *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT:
			if (!json_value(*static_cast<const VkAttachmentReferenceStencilLayout *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE:
			if (!json_value(*static_cast<const VkSubpassDescriptionDepthStencilResolve *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR:
			if (!json_value(*static_cast<const VkFragmentShadingRateAttachmentInfoKHR *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO_KHR:
			if (!json_value(*static_cast<const VkPipelineRenderingCreateInfoKHR *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineColorWriteCreateInfoEXT *>(pNext), alloc, &next, dynamic_state_info))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineSampleLocationsStateCreateInfoEXT *>(pNext), alloc, &next, dynamic_state_info))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineRasterizationProvokingVertexStateCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_CUSTOM_BORDER_COLOR_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkSamplerCustomBorderColorCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_REDUCTION_MODE_CREATE_INFO:
			if (!json_value(*static_cast<const VkSamplerReductionModeCreateInfo *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO:
			if (!json_value(*static_cast<const VkRenderPassInputAttachmentAspectCreateInfo *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineDiscardRectangleStateCreateInfoEXT *>(pNext), alloc, &next, dynamic_state_info))
				return false;
			break;

		case VK_STRUCTURE_TYPE_MEMORY_BARRIER_2_KHR:
			if (!json_value(*static_cast<const VkMemoryBarrier2KHR *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR:
			if (!json_value(*static_cast<const VkPipelineFragmentShadingRateStateCreateInfoKHR *>(pNext), alloc, &next, dynamic_state_info))
				return false;
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO:
			if (!json_value(*static_cast<const VkSamplerYcbcrConversionCreateInfo *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkGraphicsPipelineLibraryCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO:
		case VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT:
			// Ignored.
			ignored = true;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR:
			if (!json_value(*static_cast<const VkPipelineLibraryCreateInfoKHR *>(pNext), alloc, true, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineViewportDepthClipControlCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR:
			if (!json_value(*static_cast<const VkPipelineCreateFlags2CreateInfoKHR *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT:
			if (!json_value(*static_cast<const VkRenderPassCreationControlEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_BORDER_COLOR_COMPONENT_MAPPING_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkSamplerBorderColorComponentMappingCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT:
			if (!json_value(*static_cast<const VkMultisampledRenderToSingleSampledInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT:
			if (!json_value(*static_cast<const VkDepthBiasRepresentationInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkRenderPassFragmentDensityMapCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT:
			if (!json_value(*static_cast<const VkSampleLocationsInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineRobustnessCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineViewportDepthClampControlCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_LOCATION_INFO_KHR:
			if (!json_value(*static_cast<const VkRenderingAttachmentLocationInfoKHR *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDERING_INPUT_ATTACHMENT_INDEX_INFO_KHR:
			if (!json_value(*static_cast<const VkRenderingInputAttachmentIndexInfoKHR *>(pNext), alloc, &next))
				return false;
			break;

		default:
			log_error_pnext_chain("Unsupported pNext found, cannot hash sType.", pNext);
			return false;
		}

		if (!ignored)
			nexts.PushBack(next, alloc);
		pNext = pin->pNext;
	}

	*out_value = nexts;
	return true;
}